

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O3

void randomize_list(read_list_t *read_list,ui32_t check_total)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ui32_t uVar3;
  ulong uVar4;
  ulong uVar5;
  read_list_t *prVar6;
  read_list_t t;
  
  if (check_total != 0) {
    uVar5 = 0;
    prVar6 = read_list;
    uVar3 = randomize_list::seq;
    do {
      if (uVar3 < 4) {
        if (uVar3 == 0) goto LAB_00104b70;
      }
      else {
        randomize_list::seq = 0;
LAB_00104b70:
        Kumu::FortunaRNG::FillRandom(&s_RNG,0x10a1f0);
        uVar3 = randomize_list::seq;
      }
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
      uVar4 = (ulong)randomize_list::tmp_ints[uVar4] % (ulong)(check_total - 1);
      randomize_list::seq = uVar3;
      if (uVar5 != uVar4) {
        uVar1 = *(undefined4 *)((long)&read_list[uVar4].position + 4);
        uVar2 = *(undefined8 *)(read_list + uVar4);
        *(undefined4 *)((long)&read_list[uVar4].position + 4) =
             *(undefined4 *)((long)&prVar6->position + 4);
        *(undefined8 *)(read_list + uVar4) = *(undefined8 *)prVar6;
        *(undefined4 *)((long)&prVar6->position + 4) = uVar1;
        *(undefined8 *)prVar6 = uVar2;
      }
      uVar5 = uVar5 + 1;
      prVar6 = prVar6 + 1;
    } while (check_total != uVar5);
  }
  return;
}

Assistant:

void
randomize_list(read_list_t* read_list, ui32_t check_total)
{
  static ui32_t tmp_ints[4];
  static ui32_t seq = 0;

  for ( ui32_t j = 0; j < check_total; j++ )
    {
      if ( seq > 3 )
	seq = 0;

      if ( seq == 0 )
	s_RNG.FillRandom((byte_t*)tmp_ints, 16);

      ui32_t i = tmp_ints[seq++] % (check_total - 1);

      if ( i == j )
	continue;

      read_list_t t = read_list[i];
      read_list[i] = read_list[j];
      read_list[j] = t;
    }
}